

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QSharedPointer<QRelation>_>::~QArrayDataPointer
          (QArrayDataPointer<QSharedPointer<QRelation>_> *this)

{
  Data *pDVar1;
  long lVar2;
  QSharedPointer<QRelation> *pQVar3;
  long lVar4;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      lVar2 = this->size;
      if (lVar2 != 0) {
        pQVar3 = this->ptr;
        lVar4 = 0;
        do {
          QSharedPointer<QRelation>::deref(*(Data **)((long)&pQVar3->d + lVar4));
          lVar4 = lVar4 + 0x10;
        } while (lVar2 << 4 != lVar4);
      }
      QArrayData::deallocate(&this->d->super_QArrayData,0x10,0x10);
      return;
    }
  }
  return;
}

Assistant:

bool deref() noexcept { return !d || d->deref(); }